

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O2

void __thiscall
crnlib::dxt1_endpoint_optimizer::optimize_endpoints
          (dxt1_endpoint_optimizer *this,vec3F *low_color,vec3F *high_color)

{
  potential_solution *this_00;
  float fVar1;
  float fVar2;
  short sVar3;
  ushort uVar4;
  unique_color *puVar5;
  uint64 uVar6;
  uint64 uVar7;
  undefined1 auVar8 [16];
  unique_color_projection *puVar9;
  unsigned_short temp;
  uint16 uVar10;
  crn_dxt_quality cVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint c;
  ulong uVar15;
  long lVar16;
  unsigned_short temp_3;
  int iVar17;
  uint uVar18;
  uint i;
  vec<3U,_float> *pvVar19;
  uint j;
  dxt1_solution_coordinates *coords;
  unique_color_projection *puVar20;
  ulong uVar21;
  int s;
  undefined1 auVar28 [12];
  int iVar22;
  ulong uVar23;
  bool bVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar29 [16];
  dxt1_solution_coordinates coords_2;
  color_quad_u8 high;
  uint8 local_214 [4];
  float local_210;
  dxt1_solution_coordinates coords_1;
  dxt1_solution_coordinates coords_4;
  uint local_1f8;
  vec3F initial_probe_high_color;
  int prev_packed_color [2];
  int local_1bc;
  vector<crnlib::unique_color_projection> evaluated_color_projections;
  vec3F initial_probe_low_color;
  undefined1 *local_198;
  long local_190;
  int d [3];
  vec3F scaled_principle_axis [2];
  vec3F orig_high_color;
  vec3F orig_low_color;
  uint probe_high [31];
  uint probe_low [31];
  
  vec<3U,_float>::vec(&orig_low_color,low_color);
  vec<3U,_float>::vec(&orig_high_color,high_color);
  potential_solution::clear(&this->m_trial_solution);
  cVar11 = this->m_pParams->m_quality;
  uVar15 = (ulong)cVar11;
  if (uVar15 < 4) {
    fVar25 = *(float *)(&DAT_001953d0 + uVar15 * 4);
    local_190 = *(long *)(&DAT_001954f0 + uVar15 * 8);
    local_198 = &DAT_001954e0 + *(int *)(&DAT_001954e0 + uVar15 * 4);
    local_1bc = *(int *)(&DAT_001953e0 + uVar15 * 4);
  }
  else {
    local_1bc = 4;
    local_198 = g_uber_probe_table;
    local_190 = 0xf;
    fVar25 = 0.015625;
  }
  if (this->m_pParams->m_endpoint_caching == true) {
    uVar15 = 4;
    if (this->m_num_prev_results < 4) {
      uVar15 = (ulong)this->m_num_prev_results;
    }
    coords = this->m_prev_results;
    while (bVar24 = uVar15 != 0, uVar15 = uVar15 - 1, bVar24) {
      evaluate_solution(this,coords,false);
      coords = coords + 1;
    }
    if ((this->m_best_solution).m_error == 0) {
      return_solution(this);
      return;
    }
    cVar11 = this->m_pParams->m_quality;
  }
  if (cCRNDXTQualityNormal < cVar11) {
    try_median4(this,&orig_low_color,&orig_high_color);
  }
  operator*(&this->m_principle_axis,fVar25);
  vec<3U,_float>::operator=
            (scaled_principle_axis + 1,(vec<3U,_float> *)&evaluated_color_projections);
  fVar25 = (float)scaled_principle_axis[1].m_s._0_8_;
  scaled_principle_axis[1].m_s[1] = SUB84(scaled_principle_axis[1].m_s._0_8_,4) * 63.0;
  scaled_principle_axis[1].m_s[0] = fVar25 * 31.0;
  scaled_principle_axis[1].m_s[2] = scaled_principle_axis[1].m_s[2] * 31.0;
  vec<3U,_float>::operator-(scaled_principle_axis + 1);
  vec<3U,_float>::operator=(scaled_principle_axis,(vec<3U,_float> *)&evaluated_color_projections);
  fVar25 = (float)*(undefined8 *)low_color->m_s * 31.0;
  fVar26 = (float)((ulong)*(undefined8 *)low_color->m_s >> 0x20) * 63.0;
  auVar29._4_4_ = fVar26;
  auVar29._0_4_ = fVar25;
  auVar29._8_8_ = 0;
  auVar29 = minps(ZEXT816(0x427c000041f80000),auVar29);
  *(ulong *)low_color->m_s =
       CONCAT44(-(uint)(0.0 <= fVar26) & auVar29._4_4_,-(uint)(0.0 <= fVar25) & auVar29._0_4_);
  fVar25 = low_color->m_s[2] * 31.0;
  auVar28 = ZEXT812(0x41f80000);
  if (fVar25 <= 31.0) {
    auVar28._4_8_ = auVar28._4_8_;
    auVar28._0_4_ = fVar25;
  }
  low_color->m_s[2] = (float)(~-(uint)(fVar25 < 0.0) & auVar28._0_4_);
  fVar25 = (float)*(undefined8 *)high_color->m_s * 31.0;
  fVar26 = (float)((ulong)*(undefined8 *)high_color->m_s >> 0x20) * 63.0;
  auVar8._4_4_ = fVar26;
  auVar8._0_4_ = fVar25;
  auVar8._8_8_ = 0;
  auVar29 = minps(ZEXT816(0x427c000041f80000),auVar8);
  *(ulong *)high_color->m_s =
       CONCAT44(-(uint)(0.0 <= fVar26) & auVar29._4_4_,-(uint)(0.0 <= fVar25) & auVar29._0_4_);
  fVar26 = high_color->m_s[2] * 31.0;
  fVar25 = 31.0;
  if (fVar26 <= 31.0) {
    fVar25 = fVar26;
  }
  high_color->m_s[2] = (float)(~-(uint)(fVar26 < 0.0) & (uint)fVar25);
  for (lVar16 = 0; lVar16 != 3; lVar16 = lVar16 + 1) {
    if ((int)lVar16 == 1) {
      iVar12 = 1;
      if (this->m_perceptual != false) {
        iVar12 = 0x19;
      }
    }
    else {
      iVar12 = 2;
      if (((int)lVar16 == 0) && (this->m_perceptual != false)) {
        iVar12 = 0x10;
      }
    }
    iVar12 = math::float_to_int_round
                       ((float)iVar12 * (high_color->m_s[lVar16] - low_color->m_s[lVar16]));
    d[lVar16] = iVar12;
  }
  vector<crnlib::unique_color_projection>::vector
            (&evaluated_color_projections,(this->m_evaluated_colors).m_size);
  fVar25 = high_color->m_s[0];
  fVar26 = low_color->m_s[0];
  fVar27 = (high_color->m_s[1] + low_color->m_s[1]) * (float)d[1];
  fVar1 = high_color->m_s[2];
  fVar2 = low_color->m_s[2];
  for (uVar15 = 0; puVar9 = evaluated_color_projections.m_p,
      uVar15 < (this->m_evaluated_colors).m_size; uVar15 = uVar15 + 1) {
    puVar5 = (this->m_evaluated_colors).m_p;
    evaluated_color_projections.m_p[uVar15].projection =
         (ulong)puVar5[uVar15].m_weight *
         ((long)(int)((uint)puVar5[uVar15].m_color.field_0.field_0.b * d[2] +
                     (uint)puVar5[uVar15].m_color.field_0.field_0.g * d[1] +
                     (uint)puVar5[uVar15].m_color.field_0.field_0.r * d[0]) -
         (long)((fVar1 + fVar2) * (float)d[2] * 4.0 +
               fVar27 + fVar27 + (fVar25 + fVar26) * (float)d[0] * 4.0));
    unique_color::operator=
              (&evaluated_color_projections.m_p[uVar15].color,
               (this->m_evaluated_colors).m_p + uVar15);
  }
  uVar15 = (ulong)evaluated_color_projections.m_size;
  if (uVar15 != 0) {
    puVar20 = evaluated_color_projections.m_p + uVar15;
    lVar16 = 0x3f;
    if (uVar15 != 0) {
      for (; evaluated_color_projections.m_size >> lVar16 == 0; lVar16 = lVar16 + -1) {
      }
    }
    std::
    __introsort_loop<crnlib::unique_color_projection*,long,__gnu_cxx::__ops::_Iter_comp_iter<crnlib::__0>>
              (evaluated_color_projections.m_p,puVar20,((uint)lVar16 ^ 0x3f) * 2 ^ 0x7e);
    if (evaluated_color_projections.m_size < 0x11) {
      std::
      __insertion_sort<crnlib::unique_color_projection*,__gnu_cxx::__ops::_Iter_comp_iter<crnlib::__0>>
                (puVar9,puVar20);
    }
    else {
      puVar20 = puVar9 + 0x10;
      std::
      __insertion_sort<crnlib::unique_color_projection*,__gnu_cxx::__ops::_Iter_comp_iter<crnlib::__0>>
                (puVar9,puVar20);
      for (lVar16 = uVar15 * 0x10 + -0x100; lVar16 != 0; lVar16 = lVar16 + -0x10) {
        std::
        __unguarded_linear_insert<crnlib::unique_color_projection*,__gnu_cxx::__ops::_Val_comp_iter<crnlib::__0>>
                  (puVar20);
        puVar20 = puVar20 + 1;
      }
    }
  }
  uVar13 = (this->m_evaluated_colors).m_size;
  lVar16 = 0;
  for (uVar15 = 0; uVar13 != uVar15; uVar15 = uVar15 + 1) {
    uVar21 = uVar15 >> 1 & 0x7fffffff;
    uVar23 = (ulong)(~(uint)uVar21 + uVar13);
    if ((uVar15 & 1) != 0) {
      uVar23 = uVar21;
    }
    unique_color::operator=
              ((unique_color *)((long)&(((this->m_evaluated_colors).m_p)->m_color).field_0 + lVar16)
               ,&evaluated_color_projections.m_p[uVar23].color);
    lVar16 = lVar16 + 8;
  }
  this_00 = &this->m_best_solution;
  for (iVar12 = 0; iVar12 != local_1bc; iVar12 = iVar12 + 1) {
    if (iVar12 != 0) {
      dxt1_block::unpack_color
                ((dxt1_block *)&initial_probe_high_color,(this_00->m_coords).m_low_color,false,0xff)
      ;
      initial_probe_low_color.m_s[2] = (float)((uint)initial_probe_high_color.m_s[0] >> 0x10 & 0xff)
      ;
      initial_probe_low_color.m_s[0] = (float)((uint)initial_probe_high_color.m_s[0] & 0xff);
      initial_probe_low_color.m_s[1] = (float)((uint)initial_probe_high_color.m_s[0] >> 8 & 0xff);
      vec<3U,_float>::operator=(low_color,&initial_probe_low_color);
      dxt1_block::unpack_color
                ((dxt1_block *)&high,(this->m_best_solution).m_coords.m_high_color,false,0xff);
      initial_probe_low_color.m_s[2] = (float)((uint)high.field_0 >> 0x10 & 0xff);
      initial_probe_low_color.m_s[0] = (float)((uint)high.field_0 & 0xff);
      initial_probe_low_color.m_s[1] = (float)((uint)high.field_0 >> 8 & 0xff);
      vec<3U,_float>::operator=(high_color,&initial_probe_low_color);
    }
    uVar6 = (this->m_best_solution).m_error;
    if (uVar6 == 0) break;
    prev_packed_color[0] = -1;
    prev_packed_color[1] = -1;
    vec<3U,_float>::set(&initial_probe_high_color,0.5);
    operator+(low_color,&initial_probe_high_color);
    local_1f8 = 0;
    for (lVar16 = 0; lVar16 != local_190; lVar16 = lVar16 + 1) {
      sVar3 = *(short *)(local_198 + lVar16 * 2);
      uVar15 = (ulong)(lVar16 == 0);
      pvVar19 = scaled_principle_axis + uVar15;
      for (; uVar15 != 2; uVar15 = uVar15 + 1) {
        operator*(pvVar19,(float)(int)sVar3);
        operator+(&initial_probe_low_color,(vec<3U,_float> *)&high);
        fVar25 = initial_probe_high_color.m_s[1];
        fVar26 = floorf(initial_probe_high_color.m_s[0]);
        iVar22 = (int)fVar26;
        if (0x1e < iVar22) {
          iVar22 = 0x1f;
        }
        if (iVar22 < 1) {
          iVar22 = 0;
        }
        fVar25 = floorf(fVar25);
        iVar17 = (int)fVar25;
        if (0x3e < iVar17) {
          iVar17 = 0x3f;
        }
        if (iVar17 < 1) {
          iVar17 = 0;
        }
        fVar25 = floorf(initial_probe_high_color.m_s[2]);
        uVar13 = (uint)fVar25;
        if (0x1e < (int)uVar13) {
          uVar13 = 0x1f;
        }
        if ((int)uVar13 < 1) {
          uVar13 = 0;
        }
        uVar13 = iVar22 << 0xb | iVar17 << 5 | uVar13;
        if (uVar13 != prev_packed_color[uVar15]) {
          uVar23 = (ulong)local_1f8;
          local_1f8 = local_1f8 + 1;
          probe_low[uVar23] = uVar13;
          prev_packed_color[uVar15] = uVar13;
        }
        pvVar19 = pvVar19 + 1;
      }
    }
    prev_packed_color[0] = -1;
    prev_packed_color[1] = -1;
    vec<3U,_float>::set((vec<3U,_float> *)&high,0.5);
    operator+(high_color,(vec<3U,_float> *)&high);
    uVar15 = 0;
    for (lVar16 = 0; lVar16 != local_190; lVar16 = lVar16 + 1) {
      sVar3 = *(short *)(local_198 + lVar16 * 2);
      uVar23 = (ulong)(lVar16 == 0);
      pvVar19 = scaled_principle_axis + uVar23;
      for (; uVar23 != 2; uVar23 = uVar23 + 1) {
        operator*(pvVar19,(float)(int)sVar3);
        operator+(&initial_probe_high_color,(vec<3U,_float> *)&coords_1);
        fVar25 = floorf((float)high.field_0);
        iVar22 = (int)fVar25;
        if (0x1e < iVar22) {
          iVar22 = 0x1f;
        }
        if (iVar22 < 1) {
          iVar22 = 0;
        }
        fVar25 = floorf((float)local_214);
        iVar17 = (int)fVar25;
        if (0x3e < iVar17) {
          iVar17 = 0x3f;
        }
        if (iVar17 < 1) {
          iVar17 = 0;
        }
        fVar25 = floorf(local_210);
        uVar13 = (uint)fVar25;
        if (0x1e < (int)uVar13) {
          uVar13 = 0x1f;
        }
        if ((int)uVar13 < 1) {
          uVar13 = 0;
        }
        uVar13 = iVar22 << 0xb | iVar17 << 5 | uVar13;
        uVar21 = uVar15;
        if (uVar13 != prev_packed_color[uVar23]) {
          uVar21 = (ulong)((int)uVar15 + 1);
          probe_high[uVar15] = uVar13;
          prev_packed_color[uVar23] = uVar13;
        }
        pvVar19 = pvVar19 + 1;
        uVar15 = uVar21;
      }
    }
    for (uVar23 = 0; uVar23 != local_1f8; uVar23 = uVar23 + 1) {
      for (uVar21 = 0; uVar15 != uVar21; uVar21 = uVar21 + 1) {
        high.field_0.m_u32._0_2_ = (undefined2)probe_low[uVar23];
        uVar4 = (ushort)probe_high[uVar21];
        high.field_0.m_u32._2_2_ = uVar4;
        if ((ushort)high.field_0.m_u32._0_2_ < uVar4) {
          high.field_0.m_u32._2_2_ = high.field_0.m_u32._0_2_;
          high.field_0.m_u32._0_2_ = uVar4;
        }
        evaluate_solution(this,(dxt1_solution_coordinates *)&high,false);
      }
    }
    if (cCRNDXTQualityFast < this->m_pParams->m_quality) {
      dxt1_block::unpack_color((dxt1_block *)&high,(this_00->m_coords).m_low_color,false,0xff);
      for (lVar16 = 2; lVar16 != 0x50; lVar16 = lVar16 + 3) {
        uVar13 = (int)(char)(&UNK_0019548e)[lVar16] + ((uint)high.field_0 & 0xff);
        if (((uVar13 < 0x20) &&
            (uVar18 = (int)(char)(&UNK_0019548f)[lVar16] + ((uint)high.field_0 >> 8 & 0xff),
            uVar18 < 0x40)) &&
           (uVar14 = (int)(char)(&g_adjacency)[lVar16] + ((uint)high.field_0 >> 0x10 & 0xff),
           uVar14 < 0x20)) {
          coords_1.m_low_color = dxt1_block::pack_color(uVar13,uVar18,uVar14,false,0x7f);
          uVar4 = (this->m_best_solution).m_coords.m_high_color;
          coords_1.m_high_color = uVar4;
          if (coords_1.m_low_color < uVar4) {
            coords_1.m_high_color = coords_1.m_low_color;
            coords_1.m_low_color = uVar4;
          }
          evaluate_solution(this,&coords_1,false);
        }
      }
      if (this->m_pParams->m_quality == cCRNDXTQualityUber) {
        dxt1_block::unpack_color((dxt1_block *)&coords_1,(this_00->m_coords).m_low_color,false,0xff)
        ;
        high.field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)coords_1;
        for (lVar16 = 0; lVar16 != 3; lVar16 = lVar16 + 1) {
          for (iVar22 = -2; iVar22 < 3; iVar22 = iVar22 + 4) {
            coords_1 = (dxt1_solution_coordinates)high.field_0;
            uVar13 = (uint)*(byte *)((long)&coords_1.m_low_color + lVar16) + iVar22;
            if (uVar13 <= ((uint)(lVar16 == 1) << 5 | 0x1f)) {
              *(char *)((long)&coords_1.m_low_color + lVar16) = (char)uVar13;
              coords_2.m_low_color = dxt1_block::pack_color((color_quad_u8 *)&coords_1,false,0x7f);
              uVar4 = (this->m_best_solution).m_coords.m_high_color;
              coords_2.m_high_color = uVar4;
              if (coords_2.m_low_color < uVar4) {
                coords_2.m_high_color = coords_2.m_low_color;
                coords_2.m_low_color = uVar4;
              }
              evaluate_solution(this,&coords_2,false);
            }
          }
        }
      }
      dxt1_block::unpack_color
                ((dxt1_block *)&coords_1,(this->m_best_solution).m_coords.m_high_color,false,0xff);
      for (lVar16 = 2; lVar16 != 0x50; lVar16 = lVar16 + 3) {
        uVar13 = (int)(char)(&UNK_0019548e)[lVar16] + ((uint)coords_1 & 0xff);
        if (((uVar13 < 0x20) &&
            (uVar18 = (int)(char)(&UNK_0019548f)[lVar16] + ((uint)coords_1 >> 8 & 0xff),
            uVar18 < 0x40)) &&
           (uVar14 = (int)(char)(&g_adjacency)[lVar16] + ((uint)coords_1 >> 0x10 & 0xff),
           uVar14 < 0x20)) {
          uVar4 = (this_00->m_coords).m_low_color;
          uVar10 = dxt1_block::pack_color(uVar13,uVar18,uVar14,false,0x7f);
          coords_2.m_high_color = uVar10;
          coords_2.m_low_color = uVar4;
          if (uVar4 < uVar10) {
            coords_2.m_high_color = uVar4;
            coords_2.m_low_color = uVar10;
          }
          evaluate_solution(this,&coords_2,false);
        }
      }
      if (this->m_pParams->m_quality == cCRNDXTQualityUber) {
        dxt1_block::unpack_color
                  ((dxt1_block *)&coords_2,(this->m_best_solution).m_coords.m_high_color,false,0xff)
        ;
        coords_1 = coords_2;
        for (lVar16 = 0; lVar16 != 3; lVar16 = lVar16 + 1) {
          for (iVar22 = -2; iVar22 < 3; iVar22 = iVar22 + 4) {
            coords_2 = coords_1;
            uVar13 = (uint)*(byte *)((long)&coords_2.m_low_color + lVar16) + iVar22;
            if (uVar13 <= ((uint)(lVar16 == 1) << 5 | 0x1f)) {
              *(char *)((long)&coords_2.m_low_color + lVar16) = (char)uVar13;
              uVar4 = (this_00->m_coords).m_low_color;
              coords_4.m_high_color = dxt1_block::pack_color((color_quad_u8 *)&coords_2,false,0x7f);
              coords_4.m_low_color = uVar4;
              if (uVar4 < coords_4.m_high_color) {
                coords_4.m_low_color = coords_4.m_high_color;
                coords_4.m_high_color = uVar4;
              }
              evaluate_solution(this,&coords_4,false);
            }
          }
        }
      }
    }
    uVar7 = (this->m_best_solution).m_error;
    if ((uVar7 == 0) || (iVar12 != 0 && uVar7 == uVar6)) break;
    if (cCRNDXTQualityBetter < this->m_pParams->m_quality) {
      refine_solution(this,1);
    }
  }
  if (cCRNDXTQualityFast < this->m_pParams->m_quality) {
    if ((((this->m_best_solution).m_error != 0) && (this->m_pParams->m_pixels_have_alpha == false))
       && (((bVar24 = potential_solution::are_selectors_all_equal(this_00), !bVar24 ||
            (bVar24 = try_average_block_as_solid(this), !bVar24)) &&
           (this->m_pParams->m_quality == cCRNDXTQualityUber)))) {
      optimize_endpoint_comps(this);
    }
    if ((this->m_pParams->m_quality == cCRNDXTQualityUber) && ((this->m_best_solution).m_error != 0)
       ) {
      try_combinatorial_encoding(this);
    }
  }
  return_solution(this);
  if (this->m_pParams->m_endpoint_caching == true) {
    uVar13 = this->m_num_prev_results;
    this->m_prev_results[uVar13 & 3] = (this->m_best_solution).m_coords;
    this->m_num_prev_results = uVar13 + 1;
  }
  vector<crnlib::unique_color_projection>::~vector(&evaluated_color_projections);
  return;
}

Assistant:

void dxt1_endpoint_optimizer::optimize_endpoints(vec3F& low_color, vec3F& high_color) {
  vec3F orig_low_color(low_color);
  vec3F orig_high_color(high_color);

  m_trial_solution.clear();

  uint num_passes;
  const int16* pProbe_table = g_uber_probe_table;
  uint probe_range;
  float dist_per_trial = .015625f;

  // How many probes, and the distance between each probe depends on the quality level.
  switch (m_pParams->m_quality) {
    case cCRNDXTQualitySuperFast:
      pProbe_table = g_fast_probe_table;
      probe_range = cFastProbeTableSize;
      dist_per_trial = .027063293f;
      num_passes = 1;
      break;
    case cCRNDXTQualityFast:
      pProbe_table = g_fast_probe_table;
      probe_range = cFastProbeTableSize;
      dist_per_trial = .027063293f;
      num_passes = 2;
      break;
    case cCRNDXTQualityNormal:
      pProbe_table = g_normal_probe_table;
      probe_range = cNormalProbeTableSize;
      dist_per_trial = .027063293f;
      num_passes = 2;
      break;
    case cCRNDXTQualityBetter:
      pProbe_table = g_better_probe_table;
      probe_range = cBetterProbeTableSize;
      num_passes = 2;
      break;
    default:
      pProbe_table = g_uber_probe_table;
      probe_range = cUberProbeTableSize;
      num_passes = 4;
      break;
  }

  if (m_pParams->m_endpoint_caching) {
    // Try the previous X winning endpoints. This may not give us optimal results, but it may increase the probability of early outs while evaluating potential solutions.
    const uint num_prev_results = math::minimum<uint>(cMaxPrevResults, m_num_prev_results);
    for (uint i = 0; i < num_prev_results; i++)
      evaluate_solution(m_prev_results[i]);

    if (!m_best_solution.m_error) {
      // Got lucky - one of the previous endpoints is optimal.
      return_solution();
      return;
    }
  }

  if (m_pParams->m_quality >= cCRNDXTQualityBetter) {
    //evaluate_solution(dxt1_solution_coordinates(low_color, high_color), true, &m_best_solution);
    //refine_solution();

    try_median4(orig_low_color, orig_high_color);
  }

  uint probe_low[cUberProbeTableSize * 2 + 1];
  uint probe_high[cUberProbeTableSize * 2 + 1];

  vec3F scaled_principle_axis[2];

  scaled_principle_axis[1] = m_principle_axis * dist_per_trial;
  scaled_principle_axis[1][0] *= 31.0f;
  scaled_principle_axis[1][1] *= 63.0f;
  scaled_principle_axis[1][2] *= 31.0f;

  scaled_principle_axis[0] = -scaled_principle_axis[1];

  //vec3F initial_ofs(scaled_principle_axis * (float)-probe_range);
  //initial_ofs[0] += .5f;
  //initial_ofs[1] += .5f;
  //initial_ofs[2] += .5f;

  low_color[0] = math::clamp(low_color[0] * 31.0f, 0.0f, 31.0f);
  low_color[1] = math::clamp(low_color[1] * 63.0f, 0.0f, 63.0f);
  low_color[2] = math::clamp(low_color[2] * 31.0f, 0.0f, 31.0f);

  high_color[0] = math::clamp(high_color[0] * 31.0f, 0.0f, 31.0f);
  high_color[1] = math::clamp(high_color[1] * 63.0f, 0.0f, 63.0f);
  high_color[2] = math::clamp(high_color[2] * 31.0f, 0.0f, 31.0f);

  int d[3];
  for (uint c = 0; c < 3; c++)
    d[c] = math::float_to_int_round((high_color[c] - low_color[c]) * (c == 0 ? m_perceptual ? 16 : 2 : c == 1 ? m_perceptual ? 25 : 1 : 2));
  crnlib::vector<unique_color_projection> evaluated_color_projections(m_evaluated_colors.size());
  int64 average_projection = d[0] * (high_color[0] + low_color[0]) * 4 + d[1] * (high_color[1] + low_color[1]) * 2 + d[2] * (high_color[2] + low_color[2]) * 4;
  for (uint i = 0; i < m_evaluated_colors.size(); i++) {
    int64 delta = d[0] * m_evaluated_colors[i].m_color[0] + d[1] * m_evaluated_colors[i].m_color[1] + d[2] * m_evaluated_colors[i].m_color[2] - average_projection;
    evaluated_color_projections[i].projection = delta * m_evaluated_colors[i].m_weight;
    evaluated_color_projections[i].color = m_evaluated_colors[i];
  }
  std::sort(evaluated_color_projections.begin(), evaluated_color_projections.end(), g_unique_color_projection_sort);
  for (uint i = 0, iEnd = m_evaluated_colors.size(); i < iEnd; i++)
    m_evaluated_colors[i] = evaluated_color_projections[i & 1 ? i >> 1 : iEnd - 1 - (i >> 1)].color;

  for (uint pass = 0; pass < num_passes; pass++) {
    // Now separately sweep or probe the low and high colors along the principle axis, both positively and negatively.
    // This results in two arrays of candidate low/high endpoints. Every unique combination of candidate endpoints is tried as a potential solution.
    // In higher quality modes, the various nearby lattice neighbors of each candidate endpoint are also explored, which allows the current solution to "wobble" or "migrate"
    // to areas with lower error.
    // This entire process can be repeated up to X times (depending on the quality level) until a local minimum is established.
    // This method is very stable and scalable. It could be implemented more elegantly, but I'm now very cautious of touching this code.
    if (pass) {
      color_quad_u8 low(dxt1_block::unpack_color(m_best_solution.m_coords.m_low_color, false));
      low_color = vec3F(low.r, low.g, low.b);
      color_quad_u8 high(dxt1_block::unpack_color(m_best_solution.m_coords.m_high_color, false));
      high_color = vec3F(high.r, high.g, high.b);
    }

    const uint64 prev_best_error = m_best_solution.m_error;
    if (!prev_best_error)
      break;

    // Sweep low endpoint along principle axis, record positions
    int prev_packed_color[2] = {-1, -1};
    uint num_low_trials = 0;
    vec3F initial_probe_low_color(low_color + vec3F(.5f));
    for (uint i = 0; i < probe_range; i++) {
      const int ls = i ? 0 : 1;
      int x = pProbe_table[i];

      for (int s = ls; s < 2; s++) {
        vec3F probe_low_color(initial_probe_low_color + scaled_principle_axis[s] * (float)x);

        int r = math::clamp((int)floor(probe_low_color[0]), 0, 31);
        int g = math::clamp((int)floor(probe_low_color[1]), 0, 63);
        int b = math::clamp((int)floor(probe_low_color[2]), 0, 31);

        int packed_color = b | (g << 5U) | (r << 11U);
        if (packed_color != prev_packed_color[s]) {
          probe_low[num_low_trials++] = packed_color;
          prev_packed_color[s] = packed_color;
        }
      }
    }

    prev_packed_color[0] = -1;
    prev_packed_color[1] = -1;

    // Sweep high endpoint along principle axis, record positions
    uint num_high_trials = 0;
    vec3F initial_probe_high_color(high_color + vec3F(.5f));
    for (uint i = 0; i < probe_range; i++) {
      const int ls = i ? 0 : 1;
      int x = pProbe_table[i];

      for (int s = ls; s < 2; s++) {
        vec3F probe_high_color(initial_probe_high_color + scaled_principle_axis[s] * (float)x);

        int r = math::clamp((int)floor(probe_high_color[0]), 0, 31);
        int g = math::clamp((int)floor(probe_high_color[1]), 0, 63);
        int b = math::clamp((int)floor(probe_high_color[2]), 0, 31);

        int packed_color = b | (g << 5U) | (r << 11U);
        if (packed_color != prev_packed_color[s]) {
          probe_high[num_high_trials++] = packed_color;
          prev_packed_color[s] = packed_color;
        }
      }
    }

    // Now try all unique combinations.
    for (uint i = 0; i < num_low_trials; i++) {
      for (uint j = 0; j < num_high_trials; j++) {
        dxt1_solution_coordinates coords((uint16)probe_low[i], (uint16)probe_high[j]);
        coords.canonicalize();
        evaluate_solution(coords);
      }
    }

    if (m_pParams->m_quality >= cCRNDXTQualityNormal) {
      // Generate new candidates by exploring the low color's direct lattice neighbors
      color_quad_u8 lc(dxt1_block::unpack_color(m_best_solution.m_coords.m_low_color, false));

      for (int i = 0; i < 26; i++) {
        int r = lc.r + g_adjacency[i].x;
        if ((r < 0) || (r > 31))
          continue;

        int g = lc.g + g_adjacency[i].y;
        if ((g < 0) || (g > 63))
          continue;

        int b = lc.b + g_adjacency[i].z;
        if ((b < 0) || (b > 31))
          continue;

        dxt1_solution_coordinates coords(dxt1_block::pack_color(r, g, b, false), m_best_solution.m_coords.m_high_color);
        coords.canonicalize();
        evaluate_solution(coords);
      }

      if (m_pParams->m_quality == cCRNDXTQualityUber) {
        // Generate new candidates by exploring the low color's direct lattice neighbors - this time, explore much further separately on each axis.
        lc = dxt1_block::unpack_color(m_best_solution.m_coords.m_low_color, false);

        for (int a = 0; a < 3; a++) {
          int limit = (a == 1) ? 63 : 31;

          for (int s = -2; s <= 2; s += 4) {
            color_quad_u8 c(lc);
            int q = c[a] + s;
            if ((q < 0) || (q > limit))
              continue;

            c[a] = (uint8)q;

            dxt1_solution_coordinates coords(dxt1_block::pack_color(c, false), m_best_solution.m_coords.m_high_color);
            coords.canonicalize();
            evaluate_solution(coords);
          }
        }
      }

      // Generate new candidates by exploring the high color's direct lattice neighbors
      color_quad_u8 hc(dxt1_block::unpack_color(m_best_solution.m_coords.m_high_color, false));

      for (int i = 0; i < 26; i++) {
        int r = hc.r + g_adjacency[i].x;
        if ((r < 0) || (r > 31))
          continue;

        int g = hc.g + g_adjacency[i].y;
        if ((g < 0) || (g > 63))
          continue;

        int b = hc.b + g_adjacency[i].z;
        if ((b < 0) || (b > 31))
          continue;

        dxt1_solution_coordinates coords(m_best_solution.m_coords.m_low_color, dxt1_block::pack_color(r, g, b, false));
        coords.canonicalize();
        evaluate_solution(coords);
      }

      if (m_pParams->m_quality == cCRNDXTQualityUber) {
        // Generate new candidates by exploring the high color's direct lattice neighbors - this time, explore much further separately on each axis.
        hc = dxt1_block::unpack_color(m_best_solution.m_coords.m_high_color, false);

        for (int a = 0; a < 3; a++) {
          int limit = (a == 1) ? 63 : 31;

          for (int s = -2; s <= 2; s += 4) {
            color_quad_u8 c(hc);
            int q = c[a] + s;
            if ((q < 0) || (q > limit))
              continue;

            c[a] = (uint8)q;

            dxt1_solution_coordinates coords(m_best_solution.m_coords.m_low_color, dxt1_block::pack_color(c, false));
            coords.canonicalize();
            evaluate_solution(coords);
          }
        }
      }
    }

    if ((!m_best_solution.m_error) || ((pass) && (m_best_solution.m_error == prev_best_error)))
      break;

    if (m_pParams->m_quality >= cCRNDXTQualityUber) {
      // Attempt to refine current solution's endpoints given the current selectors using least squares.
      refine_solution(1);
    }
  }

  if (m_pParams->m_quality >= cCRNDXTQualityNormal) {
    if ((m_best_solution.m_error) && (!m_pParams->m_pixels_have_alpha)) {
      bool choose_solid_block = false;
      if (m_best_solution.are_selectors_all_equal()) {
        // All selectors equal - try various solid-block optimizations
        choose_solid_block = try_average_block_as_solid();
      }

      if ((!choose_solid_block) && (m_pParams->m_quality == cCRNDXTQualityUber)) {
        // Per-component 1D endpoint optimization.
        optimize_endpoint_comps();
      }
    }

    if (m_pParams->m_quality == cCRNDXTQualityUber) {
      if (m_best_solution.m_error) {
        // The pixels may have already been DXTc compressed by another compressor.
        // It's usually possible to recover the endpoints used to previously pack the block.
        try_combinatorial_encoding();
      }
    }
  }

  return_solution();

  if (m_pParams->m_endpoint_caching) {
    // Remember result for later reruse.
    m_prev_results[m_num_prev_results & (cMaxPrevResults - 1)] = m_best_solution.m_coords;
    m_num_prev_results++;
  }
}